

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O1

void deqp::gles31::Functional::NegativeTestShared::copytexsubimage2d_invalid_offset
               (NegativeTestContext *ctx)

{
  GLuint texture;
  string local_38;
  
  texture = 0x1234;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&texture);
  glu::CallLogWrapper::glBindTexture(&ctx->super_CallLogWrapper,0xde1,texture);
  glu::CallLogWrapper::glTexImage2D
            (&ctx->super_CallLogWrapper,0xde1,0,0x1908,0x10,0x10,0,0x1908,0x1401,(void *)0x0);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if xoffset + width > texture_width or yoffset + height > texture_height."
             ,"");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glCopyTexSubImage2D(&ctx->super_CallLogWrapper,0xde1,0,0xe,0,0,0,4,4);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexSubImage2D(&ctx->super_CallLogWrapper,0xde1,0,0,0xe,0,0,4,4);
  NegativeTestContext::expectError(ctx,0x501);
  glu::CallLogWrapper::glCopyTexSubImage2D(&ctx->super_CallLogWrapper,0xde1,0,0xe,0xe,0,0,4,4);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTextures(&ctx->super_CallLogWrapper,1,&texture);
  return;
}

Assistant:

void copytexsubimage2d_invalid_offset (NegativeTestContext& ctx)
{
	GLuint texture = 0x1234;
	ctx.glGenTextures	(1, &texture);
	ctx.glBindTexture	(GL_TEXTURE_2D, texture);
	ctx.glTexImage2D	(GL_TEXTURE_2D, 0, GL_RGBA, 16, 16, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);

	ctx.beginSection("GL_INVALID_VALUE is generated if xoffset + width > texture_width or yoffset + height > texture_height.");
	ctx.glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 14, 0, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 0, 14, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glCopyTexSubImage2D(GL_TEXTURE_2D, 0, 14, 14, 0, 0, 4, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteTextures(1, &texture);
}